

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::String> * __thiscall
asl::Array<asl::String>::insert(Array<asl::String> *this,int k,String *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  String *pSVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  undefined8 *puVar6;
  int iVar7;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  int iVar8;
  String *this_00;
  
  pSVar4 = this->_a;
  iVar1 = *(int *)&pSVar4[-1].field_2;
  iVar2 = *(int *)((long)&pSVar4[-1].field_2 + 4);
  iVar7 = k;
  if (k < 0) {
    iVar7 = iVar1;
  }
  if (iVar1 < iVar2) {
    paVar5 = &pSVar4[-1].field_2;
LAB_0011c5f1:
    if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
      memmove(this->_a + (long)iVar7 + 1,this->_a + iVar7,(long)(iVar1 - iVar7) * 0x18);
    }
    pSVar4 = this->_a;
    this_00 = pSVar4 + iVar7;
    iVar2 = x->_len;
    String::alloc(this_00,iVar2);
    this_00->_len = iVar2;
    if (this_00->_size == 0) {
      __dest = &pSVar4[iVar7].field_2;
    }
    else {
      __dest = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar4[iVar7].field_2._str;
    }
    if (x->_size == 0) {
      __src = &x->field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(x->field_2)._str;
    }
    memcpy(__dest,__src,(long)iVar2 + 1);
    *(int *)paVar5 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = *(int *)((long)&this->_a[-1].field_2 + 8);
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
             realloc(&this->_a[-1].field_2,(long)iVar8 * 0x18 + 0x10);
    if (paVar5 != (anon_union_16_2_78e7fdac_for_String_2 *)0x0) {
      this->_a = (String *)(paVar5 + 1);
      *(int *)((long)paVar5 + 4) = iVar8;
      *(int *)((long)paVar5 + 8) = iVar3;
      goto LAB_0011c5f1;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}